

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O1

Function * __thiscall soul::RewritingASTVisitor::visit(RewritingASTVisitor *this,Function *f)

{
  pointer ppVar1;
  pool_ref<soul::AST::VariableDeclaration> *v;
  pointer o;
  
  replaceExpression(this,&f->returnType);
  ppVar1 = (f->parameters).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (o = (f->parameters).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_start; o != ppVar1; o = o + 1) {
    replaceAs<soul::AST::VariableDeclaration>(this,o);
  }
  replaceAs<soul::AST::Block>(this,&f->block);
  return f;
}

Assistant:

virtual AST::Function& visit (AST::Function& f)
    {
        replaceExpression (f.returnType);

        for (auto& v : f.parameters)
            replaceAs<AST::VariableDeclaration> (v);

        replaceAs<AST::Block> (f.block);
        return f;
    }